

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHexString.cpp
# Opt level: O2

void __thiscall PDFHexString::PDFHexString(PDFHexString *this,string *inValue)

{
  PDFObject::PDFObject(&this->super_PDFObject,2);
  (this->super_PDFObject).super_RefCountObject._vptr_RefCountObject =
       (_func_int **)&PTR__PDFHexString_00370508;
  (this->mValue)._M_dataplus._M_p = (pointer)&(this->mValue).field_2;
  (this->mValue)._M_string_length = 0;
  (this->mValue).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->mValue);
  return;
}

Assistant:

PDFHexString::PDFHexString(const std::string& inValue):PDFObject(eType)
{
	mValue = inValue;
}